

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O2

void __thiscall
wasm::EquivalentClass::merge
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params)

{
  pointer ppFVar1;
  Function *target;
  pointer pPVar2;
  Function *shared;
  EquivalentClass *this_00;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *in_R8;
  ulong index;
  ParamInfo *param;
  pointer this_01;
  Function *pFStack_78;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> extraArgs;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *__range2;
  Builder local_38;
  Builder builder;
  
  this_00 = this;
  shared = createShared(this,module,params);
  for (index = 0;
      ppFVar1 = (this->functions).
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      index < (ulong)((long)(this->functions).
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      index = index + 1) {
    target = ppFVar1[index];
    extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pFStack_78 = (Function *)0x0;
    extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pPVar2 = (params->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    local_38.wasm = module;
    for (this_01 = (params->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                   _M_impl.super__Vector_impl_data._M_start; this_01 != pPVar2;
        this_01 = this_01 + 1) {
      extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)ParamInfo::lowerToExpression(this_01,&local_38,module,index);
      this_00 = (EquivalentClass *)&stack0xffffffffffffff88;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 &stack0xffffffffffffff88,
                 (Expression **)
                 &extraArgs.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    replaceWithThunk(this_00,&local_38,target,shared,in_R8,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &stack0xffffffffffffff88,(bool)((byte)(module->features).features >> 7));
    this_00 = (EquivalentClass *)&stack0xffffffffffffff88;
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               &stack0xffffffffffffff88);
  }
  return;
}

Assistant:

void EquivalentClass::merge(Module* module,
                            const std::vector<ParamInfo>& params) {
  Function* sharedFn = createShared(module, params);
  for (size_t i = 0; i < functions.size(); ++i) {
    Builder builder(*module);
    auto* func = functions[i];
    std::vector<Expression*> extraArgs;
    for (auto& param : params) {
      extraArgs.push_back(param.lowerToExpression(builder, module, i));
    }
    replaceWithThunk(builder,
                     func,
                     sharedFn,
                     params,
                     extraArgs,
                     module->features.hasTailCall());
  }
  return;
}